

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

saidx64_t sa_simplesearch64(sauchar_t *T,saidx64_t Tsize,saidx64_t *SA,saidx64_t SAsize,saint_t c,
                           saidx64_t *idx)

{
  ulong uVar1;
  saidx64_t local_90;
  int local_88;
  int local_84;
  int local_80;
  long lStack_70;
  saint_t r;
  saidx64_t p;
  saidx64_t k;
  saidx64_t j;
  saidx64_t i;
  saidx64_t half;
  saidx64_t rsize;
  saidx64_t lsize;
  saidx64_t size;
  saidx64_t *idx_local;
  saint_t c_local;
  saidx64_t SAsize_local;
  saidx64_t *SA_local;
  saidx64_t Tsize_local;
  
  if (idx != (saidx64_t *)0x0) {
    *idx = -1;
  }
  if ((((T == (sauchar_t *)0x0) || (SA == (saidx64_t *)0x0)) || (Tsize < 0)) || (SAsize < 0)) {
    Tsize_local = -1;
  }
  else {
    if ((Tsize != 0) && (SAsize != 0)) {
      lStack_70 = 0;
      p = 0;
      k = 0;
      j = SAsize >> 1;
      rsize = SAsize;
      do {
        if (rsize < 1) goto LAB_0010c1e1;
        if (SA[k + j] < Tsize) {
          local_80 = (uint)T[SA[k + j]] - c;
        }
        else {
          local_80 = -1;
        }
        if (local_80 < 0) {
          k = j + 1 + k;
          j = j - (rsize & 1U ^ 1);
        }
        else if (local_80 == 0) {
          p = k;
          i = (rsize - j) + -1;
          lStack_70 = k + j + 1;
          while (uVar1 = j, j = (long)uVar1 >> 1, 0 < (long)uVar1) {
            if (SA[p + j] < Tsize) {
              local_84 = (uint)T[SA[p + j]] - c;
            }
            else {
              local_84 = -1;
            }
            if (local_84 < 0) {
              p = j + 1 + p;
              j = j - (uVar1 & 1 ^ 1);
            }
          }
          while (j = i >> 1, 0 < i) {
            if (SA[lStack_70 + j] < Tsize) {
              local_88 = (uint)T[SA[lStack_70 + j]] - c;
            }
            else {
              local_88 = -1;
            }
            if (local_88 < 1) {
              lStack_70 = j + 1 + lStack_70;
              j = j - (i & 1U ^ 1);
            }
            i = j;
          }
LAB_0010c1e1:
          if (idx != (saidx64_t *)0x0) {
            if (lStack_70 - p < 1) {
              local_90 = k;
            }
            else {
              local_90 = p;
            }
            *idx = local_90;
          }
          return lStack_70 - p;
        }
        rsize = j;
        j = j >> 1;
      } while( true );
    }
    Tsize_local = 0;
  }
  return Tsize_local;
}

Assistant:

saidx_t
sa_simplesearch(const sauchar_t *T, saidx_t Tsize,
                const saidx_t *SA, saidx_t SAsize,
                saint_t c, saidx_t *idx) {
  saidx_t size, lsize, rsize, half;
  saidx_t i, j, k, p;
  saint_t r;

  if(idx != NULL) { *idx = -1; }
  if((T == NULL) || (SA == NULL) || (Tsize < 0) || (SAsize < 0)) { return -1; }
  if((Tsize == 0) || (SAsize == 0)) { return 0; }

  for(i = j = k = 0, size = SAsize, half = size >> 1;
      0 < size;
      size = half, half >>= 1) {
    p = SA[i + half];
    r = (p < Tsize) ? T[p] - c : -1;
    if(r < 0) {
      i += half + 1;
      half -= (size & 1) ^ 1;
    } else if(r == 0) {
      lsize = half, j = i, rsize = size - half - 1, k = i + half + 1;

      /* left part */
      for(half = lsize >> 1;
          0 < lsize;
          lsize = half, half >>= 1) {
        p = SA[j + half];
        r = (p < Tsize) ? T[p] - c : -1;
        if(r < 0) {
          j += half + 1;
          half -= (lsize & 1) ^ 1;
        }
      }

      /* right part */
      for(half = rsize >> 1;
          0 < rsize;
          rsize = half, half >>= 1) {
        p = SA[k + half];
        r = (p < Tsize) ? T[p] - c : -1;
        if(r <= 0) {
          k += half + 1;
          half -= (rsize & 1) ^ 1;
        }
      }

      break;
    }
  }

  if(idx != NULL) { *idx = (0 < (k - j)) ? j : i; }
  return k - j;
}